

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleTypeHandler.cpp
# Opt level: O2

BigPropertyIndex __thiscall
Js::SimpleTypeHandler<1UL>::GetPropertyIndex_EnumerateTTD
          (SimpleTypeHandler<1UL> *this,PropertyRecord *pRecord)

{
  BOOL BVar1;
  undefined8 in_RAX;
  ushort local_12 [4];
  PropertyIndex index;
  
  local_12[0] = (ushort)((ulong)in_RAX >> 0x30);
  BVar1 = GetDescriptor(this,pRecord->pid,local_12);
  if (BVar1 == 0) {
    TTDAbort_unrecoverable_error("We found this during enum so what is going on here?");
  }
  if ((this->descriptors[local_12[0]].field_1.Attributes & 8) == 0) {
    return (uint)local_12[0];
  }
  TTDAbort_unrecoverable_error("How is this deleted but we enumerated it anyway???");
}

Assistant:

Js::BigPropertyIndex SimpleTypeHandler<size>::GetPropertyIndex_EnumerateTTD(const Js::PropertyRecord* pRecord)
    {
        PropertyIndex index;
        if(this->GetDescriptor(pRecord->GetPropertyId(), &index))
        {
            TTDAssert(!(this->descriptors[index].Attributes & PropertyDeleted), "How is this deleted but we enumerated it anyway???");

            return (Js::BigPropertyIndex)index;
        }

        TTDAssert(false, "We found this during enum so what is going on here?");
        return Js::Constants::NoBigSlot;
    }